

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jasper.c
# Opt level: O2

int main(int argc,char **argv)

{
  FILE *__stream;
  int iVar1;
  char *pcVar2;
  cmdopts_t *__ptr;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  char *pcVar8;
  ulong uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  size_t sStack_90;
  jas_tmr_t enctmr;
  jas_tmr_t dectmr;
  
  pcVar8 = *argv;
  pcVar2 = strrchr(pcVar8,0x2f);
  cmdname = pcVar2 + 1;
  if (pcVar2 == (char *)0x0) {
    cmdname = pcVar8;
  }
  iVar1 = jas_init();
  if (iVar1 != 0) {
    abort();
  }
  __ptr = cmdopts_parse(argc,argv);
  if (__ptr->version != 0) {
    puts("2.0.16");
    __stream = _stderr;
    uVar10 = jas_getversion();
    fprintf(__stream,"libjasper %s\n",uVar10);
    exit(0);
  }
  jas_setdbglevel(__ptr->debug);
  if (__ptr->verbose != 0) {
    cmdinfo();
  }
  if (__ptr->infile == (char *)0x0) {
    lVar3 = jas_stream_fdopen(0,"rb");
    if (lVar3 != 0) goto LAB_0010242e;
    pcVar8 = "error: cannot open standard input\n";
    sStack_90 = 0x22;
  }
  else {
    lVar3 = jas_stream_fopen();
    if (lVar3 == 0) {
      pcVar8 = __ptr->infile;
      pcVar2 = "error: cannot open input image file %s\n";
LAB_00102466:
      fprintf(_stderr,pcVar2,pcVar8);
      goto LAB_00102718;
    }
LAB_0010242e:
    if (__ptr->outfile == (char *)0x0) {
      lVar4 = jas_stream_fdopen(1,"w+b");
      if (lVar4 == 0) {
        pcVar8 = "error: cannot open standard output\n";
        sStack_90 = 0x23;
        goto LAB_0010270f;
      }
    }
    else {
      lVar4 = jas_stream_fopen();
      if (lVar4 == 0) {
        pcVar8 = __ptr->outfile;
        pcVar2 = "error: cannot open output image file %s\n";
        goto LAB_00102466;
      }
    }
    if (__ptr->infmt < 0) {
      iVar1 = jas_image_getfmt(lVar3);
      __ptr->infmt = iVar1;
      if (-1 < iVar1) goto LAB_0010249f;
      pcVar8 = "error: input image has unknown format\n";
    }
    else {
LAB_0010249f:
      jas_tmr_start(&dectmr);
      lVar5 = jas_image_decode(lVar3,__ptr->infmt,__ptr->inopts);
      if (lVar5 == 0) {
        pcVar8 = "error: cannot load image data\n";
        sStack_90 = 0x1e;
        goto LAB_0010270f;
      }
      jas_tmr_stop(&dectmr);
      uVar10 = jas_tmr_get(&dectmr);
      if ((-1 < __ptr->cmptno) &&
         (uVar9 = (ulong)*(uint *)(lVar5 + 0x20), __ptr->cmptno < (long)uVar9)) {
        while( true ) {
          uVar9 = uVar9 - 1;
          if ((int)(uint)uVar9 < 0) break;
          if (__ptr->cmptno != (ulong)((uint)uVar9 & 0x7fffffff)) {
            jas_image_delcmpt(lVar5,uVar9 & 0xffffffff);
          }
        }
      }
      lVar7 = lVar5;
      if (__ptr->srgb != 0) {
        jas_eprintf("forcing conversion to sRGB\n");
        lVar6 = jas_cmprof_createfromclrspc(0x401);
        if (lVar6 == 0) {
          pcVar8 = "cannot create sRGB profile\n";
        }
        else {
          lVar7 = jas_image_chclrspc(lVar5,lVar6,0);
          if (lVar7 != 0) {
            jas_image_destroy(lVar5);
            jas_cmprof_destroy(lVar6);
            goto LAB_00102574;
          }
          pcVar8 = "cannot convert to sRGB\n";
        }
        jas_eprintf(pcVar8);
        goto LAB_00102718;
      }
LAB_00102574:
      jas_tmr_start(&enctmr);
      iVar1 = jas_image_encode(lVar7,lVar4,__ptr->outfmt,__ptr->outopts);
      if (iVar1 != 0) {
        pcVar8 = "error: cannot encode image\n";
        sStack_90 = 0x1b;
        goto LAB_0010270f;
      }
      jas_stream_flush(lVar4);
      jas_tmr_stop(&enctmr);
      uVar11 = jas_tmr_get(&enctmr);
      if (__ptr->verbose != 0) {
        fprintf(_stderr,"decoding time = %f\n",uVar10);
        fprintf(_stderr,"encoding time = %f\n",uVar11);
      }
      jas_stream_close(lVar3);
      iVar1 = jas_stream_close(lVar4);
      if (iVar1 == 0) {
        free(__ptr);
        jas_image_destroy(lVar7);
        jas_image_clearfmts();
        return 0;
      }
      pcVar8 = "error: cannot close output image file\n";
    }
    sStack_90 = 0x26;
  }
LAB_0010270f:
  fwrite(pcVar8,sStack_90,1,_stderr);
LAB_00102718:
  exit(1);
}

Assistant:

int main(int argc, char **argv)
{
	jas_image_t *image;
	cmdopts_t *cmdopts;
	jas_stream_t *in;
	jas_stream_t *out;
	jas_tmr_t dectmr;
	jas_tmr_t enctmr;
	double dectime;
	double enctime;
	int_fast16_t numcmpts;
	int i;

	/* Determine the base name of this command. */
	if ((cmdname = strrchr(argv[0], '/'))) {
		++cmdname;
	} else {
		cmdname = argv[0];
	}

	if (jas_init()) {
		abort();
	}

	/* Parse the command line options. */
	if (!(cmdopts = cmdopts_parse(argc, argv))) {
		fprintf(stderr, "error: cannot parse command line\n");
		exit(EXIT_FAILURE);
	}

	if (cmdopts->version) {
		printf("%s\n", JAS_VERSION);
		fprintf(stderr, "libjasper %s\n", jas_getversion());
		exit(EXIT_SUCCESS);
	}

	jas_setdbglevel(cmdopts->debug);
#if defined(JAS_DEFAULT_MAX_MEM_USAGE)
	jas_set_max_mem_usage(cmdopts->max_mem);
#endif

	if (cmdopts->verbose) {
		cmdinfo();
	}

	/* Open the input image file. */
	if (cmdopts->infile) {
		/* The input image is to be read from a file. */
		if (!(in = jas_stream_fopen(cmdopts->infile, "rb"))) {
			fprintf(stderr, "error: cannot open input image file %s\n",
			  cmdopts->infile);
			exit(EXIT_FAILURE);
		}
	} else {
		/* The input image is to be read from standard input. */
		if (!(in = jas_stream_fdopen(0, "rb"))) {
			fprintf(stderr, "error: cannot open standard input\n");
			exit(EXIT_FAILURE);
		}
	}

	/* Open the output image file. */
	if (cmdopts->outfile) {
		/* The output image is to be written to a file. */
		if (!(out = jas_stream_fopen(cmdopts->outfile, "w+b"))) {
			fprintf(stderr, "error: cannot open output image file %s\n",
			  cmdopts->outfile);
			exit(EXIT_FAILURE);
		}
	} else {
		/* The output image is to be written to standard output. */
		if (!(out = jas_stream_fdopen(1, "w+b"))) {
			fprintf(stderr, "error: cannot open standard output\n");
			exit(EXIT_FAILURE);
		}
	}

	if (cmdopts->infmt < 0) {
		if ((cmdopts->infmt = jas_image_getfmt(in)) < 0) {
			fprintf(stderr, "error: input image has unknown format\n");
			exit(EXIT_FAILURE);
		}
	}

	/* Get the input image data. */
	jas_tmr_start(&dectmr);
	if (!(image = jas_image_decode(in, cmdopts->infmt, cmdopts->inopts))) {
		fprintf(stderr, "error: cannot load image data\n");
		exit(EXIT_FAILURE);
	}
	jas_tmr_stop(&dectmr);
	dectime = jas_tmr_get(&dectmr);

	/* If requested, throw away all of the components except one.
	  Why might this be desirable?  It is a hack, really.
	  None of the image formats other than the JPEG-2000 ones support
	  images with two, four, five, or more components.  This hack
	  allows such images to be decoded with the non-JPEG-2000 decoders,
	  one component at a time. */
	numcmpts = jas_image_numcmpts(image);
	if (cmdopts->cmptno >= 0 && cmdopts->cmptno < numcmpts) {
		for (i = numcmpts - 1; i >= 0; --i) {
			if (i != cmdopts->cmptno) {
				jas_image_delcmpt(image, i);
			}
		}
	}

	if (cmdopts->srgb) {
		jas_image_t *newimage;
		jas_cmprof_t *outprof;
		jas_eprintf("forcing conversion to sRGB\n");
		if (!(outprof = jas_cmprof_createfromclrspc(JAS_CLRSPC_SRGB))) {
			jas_eprintf("cannot create sRGB profile\n");
			exit(EXIT_FAILURE);
		}
		if (!(newimage = jas_image_chclrspc(image, outprof, JAS_CMXFORM_INTENT_PER))) {
			jas_eprintf("cannot convert to sRGB\n");
			exit(EXIT_FAILURE);
		}
		jas_image_destroy(image);
		jas_cmprof_destroy(outprof);
		image = newimage;
	}

	/* Generate the output image data. */
	jas_tmr_start(&enctmr);
	if (jas_image_encode(image, out, cmdopts->outfmt, cmdopts->outopts)) {
		fprintf(stderr, "error: cannot encode image\n");
		exit(EXIT_FAILURE);
	}
	jas_stream_flush(out);
	jas_tmr_stop(&enctmr);
	enctime = jas_tmr_get(&enctmr);

	if (cmdopts->verbose) {
		fprintf(stderr, "decoding time = %f\n", dectime);
		fprintf(stderr, "encoding time = %f\n", enctime);
	}

	/* If this fails, we don't care. */
	(void) jas_stream_close(in);

	/* Close the output image stream. */
	if (jas_stream_close(out)) {
		fprintf(stderr, "error: cannot close output image file\n");
		exit(EXIT_FAILURE);
	}

	cmdopts_destroy(cmdopts);
	jas_image_destroy(image);
	jas_image_clearfmts();

	/* Success at last! :-) */
	return EXIT_SUCCESS;
}